

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

void __thiscall
wallet::OutputGroupTypeMap::Push
          (OutputGroupTypeMap *this,OutputGroup *group,OutputType type,bool insert_positive,
          bool insert_mixed)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  CAmount CVar4;
  byte in_CL;
  byte bVar5;
  undefined4 in_EDX;
  OutputGroup *in_RSI;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  Groups *groups;
  undefined6 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = in_CL & 1;
  bVar2 = in_R8B & 1;
  bVar3 = std::
          vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::empty((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)(CONCAT17(in_CL,CONCAT16(in_R8B,in_stack_ffffffffffffffd8)) & 0x101ffffffffffff
                     ));
  if (!bVar3) {
    std::
    map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
    ::operator[]((map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
                  *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),(key_type *)in_RDI);
    if (((bVar5 & 1) != 0) &&
       (CVar4 = OutputGroup::GetSelectionAmount
                          ((OutputGroup *)CONCAT17(bVar5,CONCAT16(bVar2,in_stack_ffffffffffffffd8)))
       , 0 < CVar4)) {
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>(in_RDI,in_RSI);
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>(in_RDI,in_RSI);
    }
    if ((bVar2 & 1) != 0) {
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>(in_RDI,in_RSI);
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>(in_RDI,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void OutputGroupTypeMap::Push(const OutputGroup& group, OutputType type, bool insert_positive, bool insert_mixed)
{
    if (group.m_outputs.empty()) return;

    Groups& groups = groups_by_type[type];
    if (insert_positive && group.GetSelectionAmount() > 0) {
        groups.positive_group.emplace_back(group);
        all_groups.positive_group.emplace_back(group);
    }
    if (insert_mixed) {
        groups.mixed_group.emplace_back(group);
        all_groups.mixed_group.emplace_back(group);
    }
}